

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void tinyexr::wenc16(unsigned_short a,unsigned_short b,unsigned_short *l,unsigned_short *h)

{
  uint uVar1;
  int iVar2;
  int d;
  int m;
  int ao;
  unsigned_short *h_local;
  unsigned_short *l_local;
  unsigned_short b_local;
  unsigned_short a_local;
  
  uVar1 = a + 0x8000 & 0xffff;
  m._0_2_ = (unsigned_short)((int)(uVar1 + b) >> 1);
  iVar2 = uVar1 - b;
  if (iVar2 < 0) {
    m._0_2_ = (unsigned_short)m + 0x8000;
  }
  *l = (unsigned_short)m;
  *h = (unsigned_short)iVar2;
  return;
}

Assistant:

inline void wenc16(unsigned short a, unsigned short b, unsigned short &l,
                   unsigned short &h) {
  int ao = (a + A_OFFSET) & MOD_MASK;
  int m = ((ao + b) >> 1);
  int d = ao - b;

  if (d < 0) m = (m + M_OFFSET) & MOD_MASK;

  d &= MOD_MASK;

  l = static_cast<unsigned short>(m);
  h = static_cast<unsigned short>(d);
}